

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O0

int amqpvalue_get_map_key_value_pair
              (AMQP_VALUE map,uint32_t index,AMQP_VALUE *key,AMQP_VALUE *value)

{
  LOGGER_LOG p_Var1;
  AMQP_VALUE pAVar2;
  undefined8 in_stack_ffffffffffffff78;
  undefined4 uVar3;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  AMQP_VALUE_DATA *value_data;
  LOGGER_LOG l;
  int result;
  AMQP_VALUE *value_local;
  AMQP_VALUE *key_local;
  uint32_t index_local;
  AMQP_VALUE map_local;
  
  uVar3 = (undefined4)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  if (((map == (AMQP_VALUE)0x0) || (key == (AMQP_VALUE *)0x0)) || (value == (AMQP_VALUE *)0x0)) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                ,"amqpvalue_get_map_key_value_pair",0x6d5,1,
                "Bad arguments: map = %p, key = %p, value = %p",map,key,value);
    }
    l._4_4_ = 0x6d6;
  }
  else if (map->type == AMQP_TYPE_MAP) {
    if (index < (map->value).binary_value.length) {
      pAVar2 = amqpvalue_clone(*(AMQP_VALUE *)
                                (&((map->value).described_value.descriptor)->type + (ulong)index * 4
                                ));
      *key = pAVar2;
      if (*key == (AMQP_VALUE)0x0) {
        p_Var1 = xlogging_get_log_function();
        if (p_Var1 != (LOGGER_LOG)0x0) {
          (*p_Var1)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                    ,"amqpvalue_get_map_key_value_pair",0x6ef,1,"Could not clone index %u key",
                    CONCAT44(uVar3,index));
        }
        l._4_4_ = 0x6f0;
      }
      else {
        pAVar2 = amqpvalue_clone((&((map->value).described_value.descriptor)->value)[index].
                                 described_value.descriptor);
        *value = pAVar2;
        if (*value == (AMQP_VALUE)0x0) {
          amqpvalue_destroy(*key);
          p_Var1 = xlogging_get_log_function();
          if (p_Var1 != (LOGGER_LOG)0x0) {
            (*p_Var1)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                      ,"amqpvalue_get_map_key_value_pair",0x6f9,1,"Could not clone index %u value",
                      CONCAT44(uVar3,index));
          }
          l._4_4_ = 0x6fa;
        }
        else {
          l._4_4_ = 0;
        }
      }
    }
    else {
      p_Var1 = xlogging_get_log_function();
      if (p_Var1 != (LOGGER_LOG)0x0) {
        (*p_Var1)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                  ,"amqpvalue_get_map_key_value_pair",0x6e5,1,"Index out of range: %u",
                  CONCAT44(uVar3,index));
      }
      l._4_4_ = 0x6e6;
    }
  }
  else {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                ,"amqpvalue_get_map_key_value_pair",0x6df,1,"Value is not of type MAP");
    }
    l._4_4_ = 0x6e0;
  }
  return l._4_4_;
}

Assistant:

int amqpvalue_get_map_key_value_pair(AMQP_VALUE map, uint32_t index, AMQP_VALUE* key, AMQP_VALUE* value)
{
    int result;

    /* Codes_SRS_AMQPVALUE_01_201: [If any of the map, key or value arguments is NULL, amqpvalue_get_map_key_value_pair shall fail and return a non-zero value.] */
    if ((map == NULL) ||
        (key == NULL) ||
        (value == NULL))
    {
        LogError("Bad arguments: map = %p, key = %p, value = %p",
            map, key, value);
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE_DATA* value_data = (AMQP_VALUE_DATA*)map;

        if (value_data->type != AMQP_TYPE_MAP)
        {
            /* Codes_SRS_AMQPVALUE_01_205: [If the map argument is not an AMQP value created with the amqpvalue_create_map function then amqpvalue_get_map_key_value_pair shall fail and return a non-zero value.] */
            LogError("Value is not of type MAP");
            result = MU_FAILURE;
        }
        else if (value_data->value.map_value.pair_count <= index)
        {
            /* Codes_SRS_AMQPVALUE_01_204: [If the index argument is greater or equal to the number of key/value pairs in the map then amqpvalue_get_map_key_value_pair shall fail and return a non-zero value.] */
            LogError("Index out of range: %u", (unsigned int)index);
            result = MU_FAILURE;
        }
        else
        {
            /* Codes_SRS_AMQPVALUE_01_199: [amqpvalue_get_map_key_value_pair shall fill in the key and value arguments copies of the key/value pair on the 0 based position index in a map.] */
            *key = amqpvalue_clone(value_data->value.map_value.pairs[index].key);
            if (*key == NULL)
            {
                /* Codes_SRS_AMQPVALUE_01_202: [If cloning the key fails, amqpvalue_get_map_key_value_pair shall fail and return a non-zero value.] */
                LogError("Could not clone index %u key", (unsigned int)index);
                result = MU_FAILURE;
            }
            else
            {
                *value = amqpvalue_clone(value_data->value.map_value.pairs[index].value);
                if (*value == NULL)
                {
                    /* Codes_SRS_AMQPVALUE_01_203: [If cloning the value fails, amqpvalue_get_map_key_value_pair shall fail and return a non-zero value.] */
                    amqpvalue_destroy(*key);
                    LogError("Could not clone index %u value", (unsigned int)index);
                    result = MU_FAILURE;
                }
                else
                {
                    /* Codes_SRS_AMQPVALUE_01_200: [On success amqpvalue_get_map_key_value_pair shall return 0.] */
                    result = 0;
                }
            }
        }
    }

    return result;
}